

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_qpak.c
# Opt level: O2

void * QPAK_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  int iVar1;
  PHYSFS_uint32 PVar2;
  PHYSFS_uint32 PVar3;
  int iVar4;
  void *opaque;
  void *pvVar5;
  PHYSFS_uint32 val;
  PHYSFS_uint32 size;
  PHYSFS_uint32 pos;
  char local_68 [56];
  
  val = 0;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_qpak.c"
                  ,0x43,"void *QPAK_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&val,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    PVar2 = PHYSFS_swapULE32(val);
    if (PVar2 == 0x4b434150) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&val,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      PVar2 = PHYSFS_swapULE32(val);
      iVar1 = __PHYSFS_readAll(io,&val,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      PVar3 = PHYSFS_swapULE32(val);
      if ((PVar3 & 0x3f) == 0) {
        iVar1 = (*io->seek)(io,(PHYSFS_uint64)PVar2);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        opaque = UNPK_openArchive(io);
        if (opaque == (void *)0x0) {
          return (void *)0x0;
        }
        iVar1 = (PVar3 >> 6) + 1;
        do {
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) {
            return opaque;
          }
          iVar4 = __PHYSFS_readAll(io,local_68,0x38);
          if (((iVar4 == 0) || (iVar4 = __PHYSFS_readAll(io,&pos,4), iVar4 == 0)) ||
             (iVar4 = __PHYSFS_readAll(io,&size,4), iVar4 == 0)) break;
          size = PHYSFS_swapULE32(size);
          pos = PHYSFS_swapULE32(pos);
          pvVar5 = UNPK_addEntry(opaque,local_68,0,-1,-1,(ulong)pos,(ulong)size);
        } while (pvVar5 != (void *)0x0);
        UNPK_abandonArchive(opaque);
        return (void *)0x0;
      }
      errcode = PHYSFS_ERR_CORRUPT;
    }
    else {
      errcode = PHYSFS_ERR_UNSUPPORTED;
    }
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *QPAK_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    PHYSFS_uint32 val = 0;
    PHYSFS_uint32 pos = 0;
    PHYSFS_uint32 count = 0;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    if (PHYSFS_swapULE32(val) != QPAK_SIG)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    pos = PHYSFS_swapULE32(val);  /* directory table offset. */

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    count = PHYSFS_swapULE32(val);

    /* corrupted archive? */
    BAIL_IF((count % 64) != 0, PHYSFS_ERR_CORRUPT, NULL);
    count /= 64;

    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!qpakLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}